

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Texture2DGradientTestCase
          (Texture2DGradientTestCase *this,TestContext *testCtx,char *name,char *desc,
          TextureFormat format,IVec3 *dimensions,VkFilter magFilter,VkFilter minFilter,
          VkSamplerMipmapMode mipmapFilter,VkSamplerAddressMode wrappingMode,bool useDerivatives)

{
  ImageViewParameters *pIVar1;
  ShaderSpec *this_00;
  string *this_01;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_02;
  bool bVar2;
  uint uVar3;
  LookupLodMode LVar4;
  string *psVar5;
  VkFormat VVar6;
  uint uVar7;
  long lVar8;
  ImageViewParameters *this_03;
  ImageViewParameters *pIVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  int local_10c;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  string *local_c8;
  int local_bc;
  string arg;
  
  bVar10 = 0;
  local_c8 = (string *)CONCAT44(local_c8._4_4_,(int)dimensions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,name,(allocator<char> *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"...",(allocator<char> *)&local_10c);
  TestCase::TestCase((TestCase *)this,testCtx,&arg,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&arg);
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TextureFilteringTestCase_00c0b3c0;
  (this->super_TextureFilteringTestCase).m_executor.
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = (ShaderExecutor *)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Vector<int,_3>::Vector(&(this->super_TextureFilteringTestCase).m_testCaseData.imParams.size);
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2._M_local_buf[0] =
       '\0';
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2._M_local_buf[0] = '\0';
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TextureFilteringTestCase_00c0b340;
  this->m_format = (TextureFormat)desc;
  tcu::Vector<int,_3>::Vector(&this->m_dimensions,(Vector<int,_3> *)format);
  this->m_magFilter = (VkFilter)local_c8;
  this->m_minFilter = magFilter;
  this->m_mipmapFilter = minFilter;
  this->m_wrappingMode = mipmapFilter;
  this->m_useDerivatives = (bool)(undefined1)wrappingMode;
  uVar7 = (this->m_dimensions).m_data[0];
  uVar3 = (this->m_dimensions).m_data[1];
  local_108._0_4_ = 2;
  VVar6 = ::vk::mapTextureFormat(&this->m_format);
  if ((int)uVar3 < (int)uVar7) {
    uVar3 = uVar7;
  }
  uVar7 = 0x20;
  if (uVar3 != 0) {
    uVar7 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  local_108._4_4_ = VVar6;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(local_108 + 8),&this->m_dimensions);
  local_f8._M_local_buf[8] = '\0';
  local_f8._12_4_ = 1;
  this_03 = (ImageViewParameters *)((long)&arg.field_2 + 8);
  arg._M_dataplus._M_p = (pointer)0x0;
  arg._M_string_length = 0;
  arg.field_2._M_allocated_capacity = 0;
  local_f8._M_allocated_capacity._4_4_ = 0x20 - uVar7;
  ImageViewParameters::ImageViewParameters(this_03,(ImageViewParameters *)local_108);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  _M_move_assign(&(this->super_TextureFilteringTestCase).m_testCaseData.pba,&arg);
  pIVar1 = &(this->super_TextureFilteringTestCase).m_testCaseData.imParams;
  pIVar9 = pIVar1;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    VVar6 = this_03->format;
    pIVar9->dim = this_03->dim;
    pIVar9->format = VVar6;
    this_03 = (ImageViewParameters *)((long)this_03 + (ulong)bVar10 * -0x10 + 8);
    pIVar9 = (ImageViewParameters *)((long)pIVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base((_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 *)&arg);
  uVar7 = (this->super_TextureFilteringTestCase).m_testCaseData.imParams.dim - IMG_DIM_1D;
  iVar12 = 0;
  if (uVar7 < 4) {
    iVar12 = *(int *)(&DAT_009efc70 + (ulong)uVar7 * 4);
  }
  iVar12 = (uint)(this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.
                 isProjective + iVar12;
  bVar13 = (this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed;
  bVar2 = (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare;
  bVar10 = iVar12 == 4 & bVar2;
  uVar7 = 0;
  if (bVar10 == 0) {
    uVar7 = (uint)bVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,"vec",(allocator<char> *)local_108);
  iVar11 = bVar13 + uVar7;
  std::__cxx11::string::push_back((char)&arg);
  std::__cxx11::string::append((char *)&arg);
  local_bc = (int)(char)((byte)iVar12 | 0x30);
  std::__cxx11::string::push_back((char)&arg);
  std::__cxx11::string::append((char *)&arg);
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)&arg);
    iVar11 = iVar11 + -1;
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true &&
      bVar10 == 0) {
    std::__cxx11::string::append((char *)&arg);
    iVar11 = iVar11 + -1;
  }
  this_00 = &(this->super_TextureFilteringTestCase).m_shaderSpec;
  local_c8 = (string *)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations;
  this_01 = &(this->super_TextureFilteringTestCase).m_shaderSpec.source;
  iVar12 = 0;
  if (0 < iVar11) {
    iVar12 = iVar11;
  }
  while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
    std::__cxx11::string::append((char *)&arg);
  }
  std::__cxx11::string::append((char *)&arg);
  local_108._0_8_ = &local_f8;
  local_108._8_8_ = 0;
  local_f8._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)local_108);
  if ((this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.isProjective ==
      true) {
    std::__cxx11::string::append((char *)local_108);
  }
  LVar4 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if ((LVar4 == LOOKUP_LOD_MODE_DERIVATIVES) || (LVar4 == LOOKUP_LOD_MODE_LOD)) {
    std::__cxx11::string::append((char *)local_108);
  }
  std::__cxx11::string::append((char *)local_108);
  std::__cxx11::string::append((string *)local_108);
  if ((bVar10 & (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare) == 1)
  {
    std::__cxx11::string::append((char *)local_108);
  }
  LVar4 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if (LVar4 != LOOKUP_LOD_MODE_LOD) {
    if (LVar4 != LOOKUP_LOD_MODE_DERIVATIVES) goto LAB_0076fd29;
    std::__cxx11::string::append((char *)local_108);
    std::__cxx11::string::push_back((char)(_Alloc_hider *)local_108);
    std::__cxx11::string::append((char *)local_108);
    std::__cxx11::string::append((char *)local_108);
    std::__cxx11::string::push_back((char)(_Alloc_hider *)local_108);
  }
  std::__cxx11::string::append((char *)local_108);
LAB_0076fd29:
  std::__cxx11::string::append((char *)local_108);
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::operator=((string *)this_01,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::append((char *)this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"result",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  this_02 = &(this->super_TextureFilteringTestCase).m_shaderSpec.outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_02,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"sampledCoord",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_02,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"coord",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"layer",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"dRef",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"dPdx",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"dPdy",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"lod",(allocator<char> *)&local_10c);
  glu::VarType::VarType((VarType *)&local_e8,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol((Symbol *)&arg,(string *)local_108,(VarType *)&local_e8);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,(Symbol *)&arg);
  shaderexecutor::Symbol::~Symbol((Symbol *)&arg);
  glu::VarType::~VarType((VarType *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  local_10c = 1;
  de::toString<int>(&local_e8,&local_10c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "layout(set=",&local_e8);
  std::operator+(&arg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108
                 ,", binding=0) uniform highp ");
  std::__cxx11::string::operator=(local_c8,(string *)&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,"sampler",(allocator<char> *)local_108);
  if (pIVar1->dim - IMG_DIM_1D < 4) {
    std::__cxx11::string::append((char *)&arg);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)&arg);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true) {
    std::__cxx11::string::append((char *)&arg);
  }
  psVar5 = local_c8;
  std::__cxx11::string::append(local_c8);
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::append((char *)psVar5);
  return;
}

Assistant:

Texture2DGradientTestCase (TestContext&			testCtx,
							   const char*			name,
							   const char*			desc,
							   TextureFormat		format,
							   IVec3				dimensions,
							   VkFilter				magFilter,
							   VkFilter				minFilter,
							   VkSamplerMipmapMode	mipmapFilter,
							   VkSamplerAddressMode	wrappingMode,
							   bool					useDerivatives)

		: TextureFilteringTestCase	(testCtx, name, desc)
		, m_format					(format)
		, m_dimensions				(dimensions)
		, m_magFilter				(magFilter)
		, m_minFilter				(minFilter)
		, m_mipmapFilter			(mipmapFilter)
		, m_wrappingMode			(wrappingMode)
		, m_useDerivatives			(useDerivatives)
	{
		m_testCaseData = genTestCaseData();
		initSpec();
	}